

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O2

XMLAttribute * __thiscall tinyxml2::XMLElement::FindOrCreateAttribute(XMLElement *this,char *name)

{
  bool bVar1;
  char *p;
  XMLAttribute *pXVar2;
  XMLAttribute **ppXVar3;
  XMLAttribute *pXVar4;
  
  ppXVar3 = &this->_rootAttribute;
  pXVar4 = (XMLAttribute *)0x0;
  while( true ) {
    pXVar2 = *ppXVar3;
    if (pXVar2 == (XMLAttribute *)0x0) {
      pXVar2 = CreateAttribute(this);
      ppXVar3 = &pXVar4->_next;
      if (pXVar4 == (XMLAttribute *)0x0) {
        ppXVar3 = &this->_rootAttribute;
      }
      *ppXVar3 = pXVar2;
      XMLAttribute::SetName(pXVar2,name);
      return pXVar2;
    }
    p = StrPair::GetStr(&pXVar2->_name);
    bVar1 = XMLUtil::StringEqual(p,name,0x7fffffff);
    if (bVar1) break;
    ppXVar3 = &pXVar2->_next;
    pXVar4 = pXVar2;
  }
  return pXVar2;
}

Assistant:

XMLAttribute* XMLElement::FindOrCreateAttribute( const char* name )
{
    XMLAttribute* last = 0;
    XMLAttribute* attrib = 0;
    for( attrib = _rootAttribute;
            attrib;
            last = attrib, attrib = attrib->_next ) {
        if ( XMLUtil::StringEqual( attrib->Name(), name ) ) {
            break;
        }
    }
    if ( !attrib ) {
        attrib = CreateAttribute();
        TIXMLASSERT( attrib );
        if ( last ) {
            TIXMLASSERT( last->_next == 0 );
            last->_next = attrib;
        }
        else {
            TIXMLASSERT( _rootAttribute == 0 );
            _rootAttribute = attrib;
        }
        attrib->SetName( name );
    }
    return attrib;
}